

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_1::RboSamplesCase::test(RboSamplesCase *this)

{
  bool bVar1;
  int *piVar2;
  GLenum local_24;
  undefined1 local_20 [4];
  int samples;
  StateQueryMemoryWriteGuard<int> max_samples;
  GLuint renderbufferID;
  RboSamplesCase *this_local;
  
  max_samples.m_value = 0;
  unique0x100003b6 = this;
  glu::CallLogWrapper::glGenRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,(GLuint *)&max_samples.m_value);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,max_samples.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8cab,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_20);
  piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_20);
  glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,0x8d57,piVar2);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_20,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar1) {
    glu::CallLogWrapper::glRenderbufferStorageMultisample
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,0,0x8058,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8cab,0);
    for (local_24 = 1;
        piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_20), (int)local_24 <= *piVar2;
        local_24 = local_24 + 1) {
      glu::CallLogWrapper::glRenderbufferStorageMultisample
                (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,local_24,0x8058,0x80,0x80);
      ApiCase::expectError(&this->super_ApiCase,0);
      checkRenderbufferParamGreaterOrEqual
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 &(this->super_ApiCase).super_CallLogWrapper,0x8cab,local_24);
    }
    glu::CallLogWrapper::glDeleteRenderbuffers
              (&(this->super_ApiCase).super_CallLogWrapper,1,(GLuint *)&max_samples.m_value);
  }
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, 0);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLint> max_samples;
		glGetIntegerv(GL_MAX_SAMPLES, &max_samples);
		if (!max_samples.verifyValidity(m_testCtx))
			return;

		// 0 samples is a special case
		{
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, 0, GL_RGBA8, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, 0);
		}

		// test [1, n] samples
		for (int samples = 1; samples <= max_samples; ++samples)
		{
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, GL_RGBA8, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferParamGreaterOrEqual(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, samples);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}